

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O1

void __thiscall CGL::GLScene::Mesh::draw_edges(Mesh *this)

{
  _List_node_base *p_Var1;
  DrawStyle *this_00;
  long lVar2;
  
  DrawStyle::style_edge(this->defaultStyle);
  for (p_Var1 = (this->mesh).edges.super__List_base<CGL::Edge,_std::allocator<CGL::Edge>_>._M_impl.
                _M_node.super__List_node_base._M_next;
      p_Var1 != (_List_node_base *)&(this->mesh).edges; p_Var1 = p_Var1->_M_next) {
    lVar2 = (ulong)((_List_node_base *)(this->hoveredFeature).element == p_Var1 + 1) * 8 + 0xa0;
    if ((_List_node_base *)(this->selectedFeature).element == p_Var1 + 1) {
      lVar2 = 0xb0;
    }
    this_00 = *(DrawStyle **)((long)&(this->super_SceneObject)._vptr_SceneObject + lVar2);
    if (this_00 != this->defaultStyle) {
      DrawStyle::style_edge(this_00);
    }
    glBegin(1);
    glVertex3dv(*(_List_node_base **)((long)(p_Var1[9]._M_next + 2) + 8) + 2);
    glVertex3dv(*(_List_node_base **)
                 ((long)(*(_List_node_base **)((long)(p_Var1[9]._M_next + 1) + 8) + 2) + 8) + 2);
    glEnd();
    if (this_00 != this->defaultStyle) {
      DrawStyle::style_edge(this->defaultStyle);
    }
  }
  glLineWidth(0x3f800000);
  glPointSize(0x3f800000);
  return;
}

Assistant:

void Mesh::draw_edges() const {
  defaultStyle->style_edge();
  for(EdgeCIter e = mesh.edgesBegin(); e != mesh.edgesEnd(); e++) {
    DrawStyle *style = get_draw_style(elementAddress(e));
    if (style != defaultStyle) {
      style->style_edge();
    }

    glBegin(GL_LINES);
    glVertex3dv(&e->halfedge()->vertex()->position.x);
    glVertex3dv(&e->halfedge()->twin()->vertex()->position.x);
    glEnd();

    if (style != defaultStyle) {
      defaultStyle->style_edge();
    }
  }
  defaultStyle->style_reset();
}